

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_menu_begin_text(nk_context *ctx,char *title,int len,nk_flags align,nk_vec2 size)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar3;
  nk_rect bounds;
  nk_vec2 size_00;
  nk_rect header_00;
  nk_widget_layout_states align_00;
  undefined4 in_ECX;
  float in_EDX;
  undefined8 in_RSI;
  nk_window *in_RDI;
  undefined8 in_XMM0_Qa;
  nk_user_font *unaff_retaddr;
  nk_flags state;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_window *win;
  nk_window *win_00;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  nk_context *in_stack_ffffffffffffffc0;
  nk_rect *in_stack_ffffffffffffffc8;
  float fVar5;
  undefined4 uVar6;
  float in_stack_fffffffffffffff0;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar7 = (undefined4)in_XMM0_Qa;
  uVar8 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  fVar5 = (float)in_RSI;
  uVar6 = (undefined4)((ulong)in_RSI >> 0x20);
  iVar4 = 0;
  if (((in_RDI == (nk_window *)0x0) ||
      (lVar2._0_4_ = in_RDI[0x23].bounds.y, lVar2._4_4_ = in_RDI[0x23].bounds.w, lVar2 == 0)) ||
     (*(long *)(*(long *)&in_RDI[0x23].bounds.y + 0xa8) == 0)) {
    iVar4 = 0;
  }
  else {
    uVar1 = in_RDI[0x23].bounds.y;
    uVar3 = in_RDI[0x23].bounds.w;
    align_00 = nk_widget(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (align_00 == NK_WIDGET_INVALID) {
      iVar4 = 0;
    }
    else {
      if ((align_00 == NK_WIDGET_ROM) ||
         (win_00 = in_RDI, (*(uint *)(CONCAT44(uVar3,uVar1) + 0x48) & 0x1000) != 0)) {
        win_00 = (nk_window *)0x0;
      }
      bounds.y = (float)in_ECX;
      bounds.x = (float)uVar3;
      bounds.w = in_EDX;
      bounds.h = fVar5;
      nk_do_button_text(&win_00->seq,(nk_command_buffer *)in_stack_ffffffffffffffc0,bounds,
                        (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),iVar4,
                        align_00,(nk_button_behavior)((ulong)win_00 >> 0x20),
                        (nk_style_button *)CONCAT44(uVar7,in_stack_fffffffffffffff0),
                        (nk_input *)CONCAT44(in_stack_fffffffffffffffc,uVar8),unaff_retaddr);
      header_00._4_8_ = in_RDI;
      header_00.x = (float)uVar6;
      header_00.h = in_stack_fffffffffffffff0;
      size_00.y = fVar5;
      size_00.x = in_EDX;
      iVar4 = nk_menu_begin((nk_context *)CONCAT44(uVar3,uVar1),win_00,
                            (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,header_00,
                            size_00);
    }
  }
  return iVar4;
}

Assistant:

NK_API nk_bool
nk_menu_begin_text(struct nk_context *ctx, const char *title, int len,
nk_flags align, struct nk_vec2 size)
{
struct nk_window *win;
const struct nk_input *in;
struct nk_rect header;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, header,
title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in, ctx->style.font))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}